

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

string * __thiscall
mocker::ir::Builder::getTypeIdentifier_abi_cxx11_
          (string *__return_storage_ptr__,Builder *this,shared_ptr<mocker::ast::Type> *type)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  allocator<char> local_69;
  undefined1 local_68 [8];
  shared_ptr<mocker::ast::ArrayType> p_2;
  shared_ptr<mocker::ast::UserDefinedType> p_1;
  allocator<char> local_31;
  undefined1 local_30 [8];
  shared_ptr<mocker::ast::BuiltinType> p;
  shared_ptr<mocker::ast::Type> *type_local;
  Builder *this_local;
  
  p.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)type;
  std::dynamic_pointer_cast<mocker::ast::BuiltinType,mocker::ast::Type>
            ((shared_ptr<mocker::ast::Type> *)local_30);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    if (peVar2->type != String) {
      __assert_fail("p->type == ast::BuiltinType::String",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/ir_builder/builder.cpp"
                    ,0x3cf,
                    "std::string mocker::ir::Builder::getTypeIdentifier(const std::shared_ptr<ast::Type> &) const"
                   );
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"string",&local_31);
    std::allocator<char>::~allocator(&local_31);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  std::shared_ptr<mocker::ast::BuiltinType>::~shared_ptr
            ((shared_ptr<mocker::ast::BuiltinType> *)local_30);
  if (!bVar1) {
    std::dynamic_pointer_cast<mocker::ast::UserDefinedType,mocker::ast::Type>
              ((shared_ptr<mocker::ast::Type> *)
               &p_2.super___shared_ptr<mocker::ast::ArrayType,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)
                       &p_2.super___shared_ptr<mocker::ast::ArrayType,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    if (bVar1) {
      peVar3 = std::
               __shared_ptr_access<mocker::ast::UserDefinedType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mocker::ast::UserDefinedType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&p_2.
                                super___shared_ptr<mocker::ast::ArrayType,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
      peVar4 = std::
               __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar3->name);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&peVar4->val);
    }
    std::shared_ptr<mocker::ast::UserDefinedType>::~shared_ptr
              ((shared_ptr<mocker::ast::UserDefinedType> *)
               &p_2.super___shared_ptr<mocker::ast::ArrayType,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (!bVar1) {
      std::dynamic_pointer_cast<mocker::ast::ArrayType,mocker::ast::Type>
                ((shared_ptr<mocker::ast::Type> *)local_68);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_68);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"_array_",&local_69);
        std::allocator<char>::~allocator(&local_69);
      }
      std::shared_ptr<mocker::ast::ArrayType>::~shared_ptr
                ((shared_ptr<mocker::ast::ArrayType> *)local_68);
      if (!bVar1) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/ir_builder/builder.cpp"
                      ,0x3d8,
                      "std::string mocker::ir::Builder::getTypeIdentifier(const std::shared_ptr<ast::Type> &) const"
                     );
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
Builder::getTypeIdentifier(const std::shared_ptr<ast::Type> &type) const {
  if (auto p = std::dynamic_pointer_cast<ast::BuiltinType>(type)) {
    assert(p->type == ast::BuiltinType::String);
    return "string";
  }
  if (auto p = std::dynamic_pointer_cast<ast::UserDefinedType>(type)) {
    return p->name->val;
  }
  if (auto p = std::dynamic_pointer_cast<ast::ArrayType>(type)) {
    return "_array_";
  }
  assert(false);
}